

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O3

_Bool sysbvm_identityDictionary_findAssociation
                (sysbvm_tuple_t dictionary,sysbvm_tuple_t key,sysbvm_tuple_t *outAssociation)

{
  sysbvm_tuple_t sVar1;
  intptr_t iVar2;
  
  *outAssociation = 0;
  if ((((dictionary & 0xf) == 0 && dictionary != 0) &&
      (iVar2 = sysbvm_identityDictionary_scanFor(dictionary,key), -1 < iVar2)) &&
     (sVar1 = *(sysbvm_tuple_t *)(*(long *)(dictionary + 0x18) + 0x10 + iVar2 * 8), sVar1 != 0)) {
    *outAssociation = sVar1;
    return true;
  }
  return false;
}

Assistant:

SYSBVM_API bool sysbvm_identityDictionary_findAssociation(sysbvm_tuple_t dictionary, sysbvm_tuple_t key, sysbvm_tuple_t *outAssociation)
{
    *outAssociation = SYSBVM_NULL_TUPLE;
    if(!sysbvm_tuple_isNonNullPointer(dictionary))
        return false;

    intptr_t elementIndex = sysbvm_identityDictionary_scanFor(dictionary, key);
    if(elementIndex < 0)
        return false;

    sysbvm_dictionary_t *dictionaryObject = (sysbvm_dictionary_t*)dictionary;
    sysbvm_array_t *storage = (sysbvm_array_t*)dictionaryObject->storage;
    if(!storage->elements[elementIndex])
        return false;

    *outAssociation = storage->elements[elementIndex];
    return true;
}